

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O3

void shock_effect(void *vo,int level,int dam,int target)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  CHAR_DATA *ch;
  
  if (target == 0) {
    pvVar2 = *(void **)((long)vo + 0x98);
    while (pvVar2 != (void *)0x0) {
      pvVar1 = *(void **)((long)pvVar2 + 8);
      shock_effect(pvVar2,level,dam,1);
      pvVar2 = pvVar1;
    }
  }
  else if (target == 1) {
    bVar3 = is_obj_stat((OBJ_DATA *)vo,0x18);
    if ((((!bVar3) && (bVar3 = is_obj_stat((OBJ_DATA *)vo,0xe), !bVar3)) &&
        (iVar4 = number_range(0,4), iVar4 != 0)) &&
       (bVar3 = is_obj_stat((OBJ_DATA *)vo,8),
       (ushort)((short)*(undefined4 *)((long)vo + 0x98) - 3U) < 2)) {
      iVar4 = level + 3;
      if (-1 < level) {
        iVar4 = level;
      }
      iVar5 = dam / 10 + (iVar4 >> 2);
      iVar4 = (((iVar4 >> 2) + dam / 10) - 0x19U >> 1) + 0x19;
      if (iVar5 < 0x1a) {
        iVar4 = iVar5;
      }
      iVar5 = (iVar4 - 0x32U >> 1) + 0x32;
      if (iVar4 < 0x33) {
        iVar5 = iVar4;
      }
      iVar4 = iVar5 + -5;
      if (!bVar3) {
        iVar4 = iVar5;
      }
      iVar4 = iVar4 + *(short *)((long)vo + 0x108) * -2;
      iVar5 = 0x55;
      if (iVar4 < 0x55) {
        iVar5 = iVar4;
      }
      iVar4 = -5;
      if (-5 < iVar5) {
        iVar4 = iVar5;
      }
      iVar5 = number_percent();
      if (iVar5 <= iVar4 + 10) {
        ch = *(CHAR_DATA **)((long)vo + 0x28);
        if ((ch != (CHAR_DATA *)0x0) ||
           ((*(long *)((long)vo + 0x58) != 0 &&
            (ch = *(CHAR_DATA **)(*(long *)((long)vo + 0x58) + 0x18), ch != (CHAR_DATA *)0x0)))) {
          act("$p overloads and explodes!",ch,vo,(void *)0x0,4);
        }
        extract_obj((OBJ_DATA *)vo);
        return;
      }
    }
  }
  else if (target == 2) {
    pvVar2 = *(void **)((long)vo + 0x20);
    while (pvVar2 != (void *)0x0) {
      pvVar1 = *(void **)((long)pvVar2 + 8);
      shock_effect(pvVar2,level,dam,1);
      pvVar2 = pvVar1;
    }
  }
  return;
}

Assistant:

void shock_effect(void *vo, int level, int dam, int target)
{
	if (target == TARGET_ROOM)
	{
		ROOM_INDEX_DATA *room = (ROOM_INDEX_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		for (obj = room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;
			shock_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_CHAR)
	{
		CHAR_DATA *victim = (CHAR_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		/* toast some gear */
		for (obj = victim->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;
			shock_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_OBJ)
	{
		OBJ_DATA *obj = (OBJ_DATA *)vo;
		int chance;
		char *msg;

		if (is_obj_stat(obj, ITEM_BURN_PROOF) || is_obj_stat(obj, ITEM_NOPURGE) || number_range(0, 4) == 0)
			return;

		chance = level / 4 + dam / 10;

		if (chance > 25)
			chance = (chance - 25) / 2 + 25;

		if (chance > 50)
			chance = (chance - 50) / 2 + 50;

		if (is_obj_stat(obj, ITEM_BLESS))
			chance -= 5;

		chance -= obj->level * 2;

		switch (obj->item_type)
		{
			case ITEM_WAND:
			case ITEM_STAFF:
				chance += 10;
				msg = "$p overloads and explodes!";
				break;
			case ITEM_JEWELRY:
				chance -= 10;
				msg = "$p is fused into a worthless lump.";
			default:
				return;
		}

		chance = URANGE(5, chance, 95);

		if (number_percent() > chance)
			return;

		if (obj->carried_by != nullptr)
			act(msg, obj->carried_by, obj, nullptr, TO_ALL);
		else if (obj->in_room != nullptr && obj->in_room->people != nullptr)
			act(msg, obj->in_room->people, obj, nullptr, TO_ALL);

		extract_obj(obj);
	}
}